

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_effects.c
# Opt level: O3

void readparameters(uint32 numparams,uint8 *base,uint8 **ptr,uint32 *len,
                   MOJOSHADER_effectParam **params,MOJOSHADER_effectObject *objects,
                   MOJOSHADER_malloc m,void *d)

{
  uint uVar1;
  uint32 *puVar2;
  uint32 uVar3;
  MOJOSHADER_effectParam *pMVar4;
  uint32 typeoffset;
  uint32 numannos;
  uint32 valoffset;
  long lVar5;
  
  if (numparams != 0) {
    pMVar4 = (MOJOSHADER_effectParam *)(*m)(numparams * 0x50,d);
    *params = pMVar4;
    lVar5 = 0;
    memset(pMVar4,0,(ulong)(numparams * 0x50));
    do {
      pMVar4 = *params;
      uVar1 = *len;
      typeoffset = 0;
      valoffset = 0;
      uVar3 = 0;
      numannos = 0;
      if (3 < uVar1) {
        puVar2 = (uint32 *)*ptr;
        typeoffset = *puVar2;
        *ptr = (uint8 *)(puVar2 + 1);
        *len = uVar1 - 4;
        if (uVar1 - 4 < 4) {
          valoffset = 0;
        }
        else {
          valoffset = puVar2[1];
          *ptr = (uint8 *)(puVar2 + 2);
          if ((uVar1 & 0xfffffffc) != 8) {
            *ptr = (uint8 *)(puVar2 + 3);
            *len = uVar1 - 0xc;
            if (3 < uVar1 - 0xc) {
              numannos = puVar2[3];
              *ptr = (uint8 *)(puVar2 + 4);
              uVar3 = uVar1 - 0x10;
              goto LAB_001270a7;
            }
          }
        }
        uVar3 = 0;
        numannos = 0;
      }
LAB_001270a7:
      *len = uVar3;
      *(uint32 *)((long)&pMVar4->annotation_count + lVar5) = numannos;
      readannotations(numannos,base,ptr,len,
                      (MOJOSHADER_effectAnnotation **)((long)&pMVar4->annotations + lVar5),objects,m
                      ,d);
      readvalue(base,typeoffset,valoffset,
                (MOJOSHADER_effectValue *)((long)&(pMVar4->value).name + lVar5),objects,m,d);
      lVar5 = lVar5 + 0x50;
    } while ((ulong)numparams * 0x50 != lVar5);
  }
  return;
}

Assistant:

static void readparameters(const uint32 numparams,
                           const uint8 *base,
                           const uint8 **ptr,
                           uint32 *len,
                           MOJOSHADER_effectParam **params,
                           MOJOSHADER_effectObject *objects,
                           MOJOSHADER_malloc m,
                           void *d)
{
    int i;
    if (numparams == 0) return;

    uint32 siz = sizeof(MOJOSHADER_effectParam) * numparams;
    *params = (MOJOSHADER_effectParam *) m(siz, d);
    memset(*params, '\0', siz);

    for (i = 0; i < numparams; i++)
    {
        MOJOSHADER_effectParam *param = &(*params)[i];

        const uint32 typeoffset = readui32(ptr, len);
        const uint32 valoffset = readui32(ptr, len);
        /*const uint32 flags =*/ readui32(ptr, len);
        const uint32 numannos = readui32(ptr, len);

        param->annotation_count = numannos;
        readannotations(numannos, base, ptr, len,
                        &param->annotations, objects,
                        m, d);

        readvalue(base, typeoffset, valoffset,
                  &param->value, objects,
                  m, d);
    } // for
}